

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O0

uint32 Bstrlib::getUnicode(uchar **array)

{
  byte bVar1;
  bool bVar2;
  uint local_2c;
  int iStack_28;
  uint8 extra;
  uint32 n;
  int charCount;
  uint32 bitCountMask;
  uint32 dataMask;
  uint8 c;
  uchar **array_local;
  
  bVar1 = **array;
  if ((bVar1 & 0x80) == 0) {
    if (bVar1 != 0) {
      *array = *array + 1;
    }
    array_local._4_4_ = (uint)bVar1;
  }
  else {
    charCount = 0x7f;
    iStack_28 = 0;
    for (n = 0x40; (bVar1 & n) != 0 && n != 0; n = n >> 1) {
      iStack_28 = iStack_28 + 1;
      charCount = (uint)charCount >> 1;
    }
    local_2c = (uint)bVar1 & charCount;
    *array = *array + 1;
    while( true ) {
      iStack_28 = iStack_28 + -1;
      bVar2 = false;
      if (-1 < iStack_28) {
        bVar2 = **array != '\0';
      }
      if ((!bVar2) || ((**array & 0xc0) != 0x80)) break;
      local_2c = **array & 0x3f | local_2c << 6;
      *array = *array + 1;
    }
    array_local._4_4_ = local_2c;
  }
  return array_local._4_4_;
}

Assistant:

uint32 getUnicode(const unsigned char * & array)
    {
        // Get the current char
        const uint8 c = *array;
        if ((c & 0x80))
        {
            // The data is in the 7 low bits
            uint32 dataMask = 0x7f;
            // The count bit mask
            uint32 bitCountMask = 0x40;
            // The consumption count
            int charCount = 0;

            while ((c & bitCountMask) != 0 && bitCountMask)
            {
                ++charCount;
                dataMask >>= 1; bitCountMask >>= 1;
            }

            // Get the few bits remaining here
            uint32 n = (c & dataMask);

            // Then extract the remaining bits
            ++array;
            while (--charCount >= 0 && *array)
            {
                const uint8 extra = *array;
                // Make sure it's a valid UTF8 encoding
                if ((extra & 0xc0) != 0x80) break;

                // Store the new bits too
                n <<= 6; n |= (extra & 0x3f);
                ++array;
            }
            return n;
        }
        if (c) ++array;
        return c;
    }